

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O1

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
          *m,OrientationMeasurement<float> *z)

{
  float *mean;
  float *cov;
  float *K_00;
  ActualDstType actualDst;
  float fVar1;
  undefined1 auStack_68 [8];
  SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> sigmaMeasurementPoints;
  KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> K;
  OrientationMeasurement<float> y;
  Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> P_yy;
  
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::
  computeSigmaPointMeasurements<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)this,m,
             (SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)auStack_68);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[4] * *(float *)(this + 0x24) +
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[3] * *(float *)(this + 0x20) +
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[2] * *(float *)(this + 0x1c) +
       *(float *)(this + 0x18) *
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[1] + *(float *)(this + 0x10) * (float)auStack_68._4_4_ +
       *(float *)(this + 0x14) *
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[0] + *(float *)(this + 0xc) * (float)auStack_68._0_4_;
  mean = K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1;
  cov = K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 2;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (OrientationMeasurement<float> *)mean,
             (SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)auStack_68,
             &(m->super_StandardBase<KalmanExamples::Robot1::OrientationMeasurement<float>_>).P,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)cov);
  K_00 = sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.
         m_storage.m_data.array + 5;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeKalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (OrientationMeasurement<float> *)mean,
             (SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)auStack_68,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)cov,
             (KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)K_00);
  fVar1 = (z->super_Vector<float,_1>).super_Matrix<float,_1,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] -
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(float *)this =
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[5] * fVar1 + *(float *)this;
  *(float *)(this + 4) =
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[6] * fVar1 + *(float *)(this + 4);
  *(float *)(this + 8) =
       fVar1 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] + *(float *)(this + 8);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  updateStateCovariance<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)K_00,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)cov);
  return (State *)this;
}

Assistant:

const State& update( const MeasurementModelType<Measurement, CovarianceBase>& m, const Measurement& z )
        {
            SigmaPoints<Measurement> sigmaMeasurementPoints;
            
            // Predict measurement (and corresponding sigma points)
            Measurement y = this->template computeMeasurementPrediction<Measurement, CovarianceBase>(m, sigmaMeasurementPoints);
            
            // Compute innovation covariance
            Covariance<Measurement> P_yy;
            computeCovarianceFromSigmaPoints(y, sigmaMeasurementPoints, m.getCovariance(), P_yy);
            
            KalmanGain<Measurement> K;
            computeKalmanGain(y, sigmaMeasurementPoints, P_yy, K);
            
            // Update state
            x += K * ( z - y );
            
            // Update state covariance
            updateStateCovariance<Measurement>(K, P_yy);
            
            return this->getState();
        }